

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

unsigned_long * __thiscall
google::protobuf::RepeatedField<unsigned_long>::AddNAlreadyReserved
          (RepeatedField<unsigned_long> *this,int n)

{
  int iVar1;
  LogMessage *pLVar2;
  LogMessage local_60;
  LogFinisher local_21;
  
  iVar1 = this->current_size_;
  if (this->total_size_ - iVar1 < n) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x4f9);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (total_size_ - current_size_) >= (n): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,this->total_size_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,", ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,this->current_size_);
    internal::LogFinisher::operator=(&local_21,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
    iVar1 = this->current_size_;
  }
  this->current_size_ = iVar1 + n;
  return (unsigned_long *)((long)iVar1 * 8 + (long)this->arena_or_elements_);
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n) {
  GOOGLE_DCHECK_GE(total_size_ - current_size_, n)
      << total_size_ << ", " << current_size_;
  // Warning: sometimes people call this when n == 0 and total_size_ == 0. In
  // this case the return pointer points to a zero size array (n == 0). Hence
  // we can just use unsafe_elements(), because the user cannot dereference the
  // pointer anyway.
  Element* ret = unsafe_elements() + current_size_;
  current_size_ += n;
  return ret;
}